

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O0

void __thiscall OpenMD::HydroIO::openWriter(HydroIO *this,ostream *os)

{
  Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_00;
  basic_ostream<char,_std::char_traits<char>_> *in_RSI;
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_RDI;
  string h;
  BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *in_stack_ffffffffffffff98
  ;
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_01;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  this_01 = (PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *)&stack0xffffffffffffffcf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  this_00 = (Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *)operator_new(8);
  rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::
  BasicOStreamWrapper((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)
                      this_00,in_RSI);
  (in_RDI->
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ).level_stack_.allocator_ = (CrtAllocator *)this_00;
  rapidjson::
  Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Reset(this_00,in_stack_ffffffffffffff98);
  *(undefined1 *)
   &in_RDI[2].
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .level_stack_.stackEnd_ = 1;
  rapidjson::
  Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::SetMaxDecimalPlaces
            ((Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)&(in_RDI->
                 super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ).level_stack_.ownAllocator_,7);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::SetIndent((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               *)&(in_RDI->
                  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                  ).level_stack_.ownAllocator_,' ',2);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(in_RDI);
  std::__cxx11::string::c_str();
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(this_01,(Ch *)in_RDI);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void HydroIO::openWriter(std::ostream& os) {
    std::string h = "OpenMD-Hydro";
#if defined(NLOHMANN_JSON)
    j_[h]       = ordered_json::array();
    writerOpen_ = true;
#elif defined(RAPID_JSON)
    osw_ = new OStreamWrapper(os);
    w_.Reset(*osw_);
    writerOpen_ = true;

    w_.SetMaxDecimalPlaces(7);
    w_.SetIndent(' ', 2);

    w_.StartObject();
    w_.Key(h.c_str());
    w_.StartArray();
#endif
  }